

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

void __thiscall GGWave::Protocols::disableAll(Protocols *this)

{
  long lVar1;
  
  for (lVar1 = 0xd; lVar1 != 0x16d; lVar1 = lVar1 + 0x10) {
    *(undefined1 *)((long)&this->data[0].name + lVar1) = 0;
  }
  return;
}

Assistant:

void GGWave::Protocols::disableAll() {
    for (int i = 0; i < GGWAVE_PROTOCOL_COUNT; i++) {
        auto & p = this->data[i];
        p.enabled = false;
    }
}